

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

void __thiscall
zmq::socket_base_t::attach_pipe
          (socket_base_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  bool bVar1;
  byte in_CL;
  byte in_DL;
  undefined8 in_RSI;
  own_t *in_RDI;
  array_t<zmq::pipe_t,_3> *unaff_retaddr;
  i_pipe_events *in_stack_ffffffffffffffd8;
  own_t *item_;
  
  item_ = in_RDI;
  pipe_t::set_event_sink((pipe_t *)in_RDI,in_stack_ffffffffffffffd8);
  array_t<zmq::pipe_t,_3>::push_back(unaff_retaddr,(pipe_t *)item_);
  (*(in_RDI->super_object_t)._vptr_object_t[0x20])
            (in_RDI,in_RSI,(ulong)(in_DL & 1),(ulong)(in_CL & 1));
  bVar1 = own_t::is_terminating(in_RDI);
  if (bVar1) {
    own_t::register_term_acks(in_RDI,1);
    pipe_t::terminate((pipe_t *)this,pipe_._7_1_);
  }
  return;
}

Assistant:

void zmq::socket_base_t::attach_pipe (pipe_t *pipe_,
                                      bool subscribe_to_all_,
                                      bool locally_initiated_)
{
    //  First, register the pipe so that we can terminate it later on.
    pipe_->set_event_sink (this);
    _pipes.push_back (pipe_);

    //  Let the derived socket type know about new pipe.
    xattach_pipe (pipe_, subscribe_to_all_, locally_initiated_);

    //  If the socket is already being closed, ask any new pipes to terminate
    //  straight away.
    if (is_terminating ()) {
        register_term_acks (1);
        pipe_->terminate (false);
    }
}